

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O2

void __thiscall OpenMD::HBondJumpZ::writeCorrelate(HBondJumpZ *this)

{
  double *pdVar1;
  char cVar2;
  ostream *poVar3;
  uint j;
  ulong uVar4;
  uint i;
  ulong uVar5;
  Revision r;
  string local_250;
  ofstream ofs;
  
  std::ofstream::ofstream
            (&ofs,(this->super_HBondJump).super_TimeCorrFunc<double>.super_DynamicProperty.
                  outputFilename_._M_dataplus._M_p,_S_out);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    snprintf(painCave.errMsg,2000,"HBondJumpZ::writeCorrelate Error: fail to open %s\n",
             (this->super_HBondJump).super_TimeCorrFunc<double>.super_DynamicProperty.
             outputFilename_._M_dataplus._M_p);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar3 = std::operator<<((ostream *)&ofs,"# ");
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_HBondJump).super_TimeCorrFunc<double>.
                                     corrFuncType_);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<((ostream *)&ofs,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(&local_250,&r);
    poVar3 = std::operator<<(poVar3,(string *)&local_250);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_250);
    poVar3 = std::operator<<((ostream *)&ofs,"# ");
    Revision::getBuildDate_abi_cxx11_(&local_250,&r);
    poVar3 = std::operator<<(poVar3,(string *)&local_250);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_250);
    poVar3 = std::operator<<((ostream *)&ofs,"# selection script1: \"");
    std::operator<<(poVar3,(string *)
                           &(this->super_HBondJump).super_TimeCorrFunc<double>.selectionScript1_);
    poVar3 = std::operator<<((ostream *)&ofs,"\"\tselection script2: \"");
    poVar3 = std::operator<<(poVar3,(string *)
                                    &(this->super_HBondJump).super_TimeCorrFunc<double>.
                                     selectionScript2_);
    std::operator<<(poVar3,"\"\n");
    poVar3 = std::operator<<((ostream *)&ofs,"# privilegedAxis computed as ");
    poVar3 = std::operator<<(poVar3,(string *)&this->axisLabel_);
    std::operator<<(poVar3," axis \n");
    if ((this->super_HBondJump).super_TimeCorrFunc<double>.paramString_._M_string_length != 0) {
      poVar3 = std::operator<<((ostream *)&ofs,"# parameters: ");
      poVar3 = std::operator<<(poVar3,(string *)
                                      &(this->super_HBondJump).super_TimeCorrFunc<double>.
                                       paramString_);
      std::operator<<(poVar3,"\n");
    }
    std::operator<<((ostream *)&ofs,"#time\tcorrVal\n");
    for (uVar5 = 0; uVar5 < (this->super_HBondJump).super_TimeCorrFunc<double>.nTimeBins_;
        uVar5 = uVar5 + 1) {
      pdVar1 = (this->super_HBondJump).super_TimeCorrFunc<double>.times_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      std::ostream::_M_insert<double>(pdVar1[uVar5] - *pdVar1);
      for (uVar4 = 0; uVar4 < this->nZBins_; uVar4 = uVar4 + 1) {
        std::operator<<((ostream *)&ofs,"\t");
        std::ostream::_M_insert<double>
                  (*(double *)
                    (*(long *)&(this->histogram_).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar5].
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data + uVar4 * 8));
      }
      std::operator<<((ostream *)&ofs,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&ofs);
  return;
}

Assistant:

void HBondJumpZ::writeCorrelate() {
    ofstream ofs(outputFilename_.c_str());

    if (ofs.is_open()) {
      Revision r;

      ofs << "# " << getCorrFuncType() << "\n";
      ofs << "# OpenMD " << r.getFullRevision() << "\n";
      ofs << "# " << r.getBuildDate() << "\n";
      ofs << "# selection script1: \"" << selectionScript1_;
      ofs << "\"\tselection script2: \"" << selectionScript2_ << "\"\n";
      ofs << "# privilegedAxis computed as " << axisLabel_ << " axis \n";
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";
      ofs << "#time\tcorrVal\n";

      for (unsigned int i = 0; i < nTimeBins_; ++i) {
        ofs << times_[i] - times_[0];

        for (unsigned int j = 0; j < nZBins_; ++j) {
          ofs << "\t" << histogram_[i][j];
        }
        ofs << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "HBondJumpZ::writeCorrelate Error: fail to open %s\n",
               outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    ofs.close();
  }